

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cpp
# Opt level: O2

dtime_t duckdb::Time::FromTimeMs(int64_t time_ms)

{
  bool bVar1;
  ConversionException *this;
  allocator local_41;
  int64_t result;
  string local_38;
  
  bVar1 = TryMultiplyOperator::Operation<long,long,long>(time_ms,1000,&result);
  if (bVar1) {
    return (dtime_t)result;
  }
  this = (ConversionException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,"Could not convert Time(MS) to Time(US)",&local_41);
  ConversionException::ConversionException(this,&local_38);
  __cxa_throw(this,&ConversionException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

dtime_t Time::FromTimeMs(int64_t time_ms) {
	int64_t result;
	if (!TryMultiplyOperator::Operation(time_ms, Interval::MICROS_PER_MSEC, result)) {
		throw ConversionException("Could not convert Time(MS) to Time(US)");
	}
	return dtime_t(result);
}